

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

BuildingInfo * __thiscall RenX::Server::getBuildingByName(Server *this,string_view name)

{
  bool bVar1;
  reference this_00;
  pointer pBVar2;
  char *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_> *building;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
  *__range1;
  Server *this_local;
  string_view name_local;
  
  rhs._M_len = name._M_str;
  __end1 = std::
           vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
           ::begin(&this->buildings);
  building = (unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_> *)
             std::
             vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
             ::end(&this->buildings);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_*,_std::vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>_>
                      (&__end1,(__normal_iterator<const_std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_*,_std::vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>_>
                                *)&building);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (BuildingInfo *)0x0;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_*,_std::vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>_>
              ::operator*(&__end1);
    pBVar2 = std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>::
             operator->(this_00);
    rhs._M_str = in_RCX;
    bVar1 = jessilib::equalsi<char,char>
                      ((jessilib *)pBVar2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       name._M_len,rhs);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_*,_std::vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>_>
    ::operator++(&__end1);
  }
  pBVar2 = std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>::get
                     (this_00);
  return pBVar2;
}

Assistant:

RenX::BuildingInfo *RenX::Server::getBuildingByName(std::string_view name) const {
	for (const auto& building : buildings) {
		if (jessilib::equalsi(building->name, name)) {
			return building.get();
		}
	}

	return nullptr;
}